

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaLoader.cpp
# Opt level: O0

void __thiscall
Assimp::ColladaLoader::StoreAnimations
          (ColladaLoader *this,aiScene *pScene,ColladaParser *pParser,Animation *pSrcAnim,
          string *pPrefix)

{
  bool bVar1;
  ulong uVar2;
  reference ppAVar3;
  __normal_iterator<Assimp::Collada::Animation_*const_*,_std::vector<Assimp::Collada::Animation_*,_std::allocator<Assimp::Collada::Animation_*>_>_>
  local_98;
  __normal_iterator<Assimp::Collada::Animation_*const_*,_std::vector<Assimp::Collada::Animation_*,_std::allocator<Assimp::Collada::Animation_*>_>_>
  local_90;
  const_iterator it;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  undefined1 local_50 [8];
  string animName;
  string *pPrefix_local;
  Animation *pSrcAnim_local;
  ColladaParser *pParser_local;
  aiScene *pScene_local;
  ColladaLoader *this_local;
  
  animName.field_2._8_8_ = pPrefix;
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::operator+(&local_70,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   animName.field_2._8_8_,"_");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                   &local_70,&pSrcAnim->mName);
    std::__cxx11::string::~string((string *)&local_70);
  }
  else {
    std::__cxx11::string::string((string *)local_50,(string *)pSrcAnim);
  }
  local_90._M_current =
       (Animation **)
       std::vector<Assimp::Collada::Animation_*,_std::allocator<Assimp::Collada::Animation_*>_>::
       begin(&pSrcAnim->mSubAnims);
  while( true ) {
    local_98._M_current =
         (Animation **)
         std::vector<Assimp::Collada::Animation_*,_std::allocator<Assimp::Collada::Animation_*>_>::
         end(&pSrcAnim->mSubAnims);
    bVar1 = __gnu_cxx::operator!=(&local_90,&local_98);
    if (!bVar1) break;
    ppAVar3 = __gnu_cxx::
              __normal_iterator<Assimp::Collada::Animation_*const_*,_std::vector<Assimp::Collada::Animation_*,_std::allocator<Assimp::Collada::Animation_*>_>_>
              ::operator*(&local_90);
    StoreAnimations(this,pScene,pParser,*ppAVar3,(string *)local_50);
    __gnu_cxx::
    __normal_iterator<Assimp::Collada::Animation_*const_*,_std::vector<Assimp::Collada::Animation_*,_std::allocator<Assimp::Collada::Animation_*>_>_>
    ::operator++(&local_90);
  }
  bVar1 = std::
          vector<Assimp::Collada::AnimationChannel,_std::allocator<Assimp::Collada::AnimationChannel>_>
          ::empty(&pSrcAnim->mChannels);
  if (!bVar1) {
    CreateAnimation(this,pScene,pParser,pSrcAnim,(string *)local_50);
  }
  std::__cxx11::string::~string((string *)local_50);
  return;
}

Assistant:

void ColladaLoader::StoreAnimations(aiScene* pScene, const ColladaParser& pParser, const Collada::Animation* pSrcAnim, const std::string &pPrefix)
{
    std::string animName = pPrefix.empty() ? pSrcAnim->mName : pPrefix + "_" + pSrcAnim->mName;

    // create nested animations, if given
    for (std::vector<Collada::Animation*>::const_iterator it = pSrcAnim->mSubAnims.begin(); it != pSrcAnim->mSubAnims.end(); ++it)
        StoreAnimations(pScene, pParser, *it, animName);

    // create animation channels, if any
    if (!pSrcAnim->mChannels.empty())
        CreateAnimation(pScene, pParser, pSrcAnim, animName);
}